

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

ResourceData *
getFallbackData(UResourceBundle *resBundle,char **resTag,UResourceDataEntry **realData,Resource *res
               ,UErrorCode *status)

{
  char *__s1;
  Resource RVar1;
  char *__s2;
  UErrorCode UVar2;
  UResourceDataEntry *pUVar3;
  UResourceDataEntry *pUVar4;
  int iVar5;
  int32_t indexR;
  int32_t local_3c;
  UResourceDataEntry **local_38;
  
  pUVar3 = resBundle->fData;
  local_3c = -1;
  *res = 0xffffffff;
  if (pUVar3 == (UResourceDataEntry *)0x0) {
LAB_002cd687:
    *status = U_MISSING_RESOURCE_ERROR;
    return (ResourceData *)0x0;
  }
  local_38 = realData;
  if (pUVar3->fBogus == U_ZERO_ERROR) {
    RVar1 = res_getTableItemByKey_63(&pUVar3->fData,(pUVar3->fData).rootRes,&local_3c,resTag);
    *res = RVar1;
    if (resBundle->fHasFallback == '\x01') {
      pUVar4 = pUVar3;
      if (RVar1 != 0xffffffff) goto LAB_002cd6a1;
      iVar5 = 1;
      goto LAB_002cd5c3;
    }
    iVar5 = 1;
LAB_002cd645:
    pUVar4 = pUVar3;
    if (RVar1 == 0xffffffff) goto LAB_002cd687;
  }
  else {
    iVar5 = 0;
    if (resBundle->fHasFallback != '\x01') goto LAB_002cd687;
LAB_002cd5c3:
    do {
      do {
        pUVar4 = pUVar3->fParent;
        if (pUVar4 == (UResourceDataEntry *)0x0) {
          RVar1 = 0xffffffff;
          goto LAB_002cd645;
        }
        pUVar3 = pUVar4;
      } while (pUVar4->fBogus != U_ZERO_ERROR);
      iVar5 = iVar5 + 1;
      RVar1 = res_getTableItemByKey_63(&pUVar4->fData,(pUVar4->fData).rootRes,&local_3c,resTag);
      *res = RVar1;
    } while (RVar1 == 0xffffffff);
  }
  realData = local_38;
  if (1 < iVar5) {
    __s1 = pUVar4->fName;
    __s2 = uloc_getDefault_63();
    iVar5 = strcmp(__s1,__s2);
    realData = local_38;
    if (iVar5 == 0) {
      UVar2 = U_USING_DEFAULT_WARNING;
    }
    else {
      iVar5 = strcmp(pUVar4->fName,"root");
      UVar2 = (uint)(iVar5 == 0) | U_ERROR_WARNING_START;
    }
    *status = UVar2;
  }
LAB_002cd6a1:
  *realData = pUVar4;
  return &pUVar4->fData;
}

Assistant:

static const ResourceData *getFallbackData(const UResourceBundle* resBundle, const char* * resTag, UResourceDataEntry* *realData, Resource *res, UErrorCode *status) {
    UResourceDataEntry *resB = resBundle->fData;
    int32_t indexR = -1;
    int32_t i = 0;
    *res = RES_BOGUS;
    if(resB != NULL) {
        if(resB->fBogus == U_ZERO_ERROR) { /* if this resource is real, */
            *res = res_getTableItemByKey(&(resB->fData), resB->fData.rootRes, &indexR, resTag); /* try to get data from there */
            i++;
        }
        if(resBundle->fHasFallback == TRUE) {
            while(*res == RES_BOGUS && resB->fParent != NULL) { /* Otherwise, we'll look in parents */
                resB = resB->fParent;
                if(resB->fBogus == U_ZERO_ERROR) {
                    i++;
                    *res = res_getTableItemByKey(&(resB->fData), resB->fData.rootRes, &indexR, resTag);
                }
            }
        }

        if(*res != RES_BOGUS) { /* If the resource is found in parents, we need to adjust the error */
            if(i>1) {
                if(uprv_strcmp(resB->fName, uloc_getDefault())==0 || uprv_strcmp(resB->fName, kRootLocaleName)==0) {
                    *status = U_USING_DEFAULT_WARNING;
                } else {
                    *status = U_USING_FALLBACK_WARNING;
                }
            }
            *realData = resB;
            return (&(resB->fData));
        } else { /* If resource is not found, we need to give an error */
            *status = U_MISSING_RESOURCE_ERROR;
            return NULL;
        }
    } else {
            *status = U_MISSING_RESOURCE_ERROR;
            return NULL;
    }
}